

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoDictionary.cpp
# Opt level: O2

PDFTextString * __thiscall
InfoDictionary::GetAdditionalInfoEntry
          (PDFTextString *__return_storage_ptr__,InfoDictionary *this,string *inKey)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PDFTextString>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PDFTextString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PDFTextString>_>_>
          ::find(&(this->mAdditionalInfoEntries)._M_t,inKey);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->mAdditionalInfoEntries)._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = (_Base_ptr)PDFTextString::Empty();
  }
  else {
    p_Var2 = iVar1._M_node + 2;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)p_Var2);
  return __return_storage_ptr__;
}

Assistant:

PDFTextString InfoDictionary::GetAdditionalInfoEntry(const std::string& inKey)
{
	StringToPDFTextString::iterator it = mAdditionalInfoEntries.find(inKey);

	if(it == mAdditionalInfoEntries.end())
		return PDFTextString::Empty();
	else
		return it->second;
}